

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O2

void __thiscall
Opcode::AABBTreeCollider::_Collide
          (AABBTreeCollider *this,AABBCollisionNode *b0,AABBCollisionNode *b1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  udword uVar25;
  ulong uVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  do {
    uVar25 = this->mNbBVBVTests;
    this->mNbBVBVTests = uVar25 + 1;
    fVar1 = (this->mR1to0).m[0][0];
    fVar2 = (b1->mAABB).mCenter.x;
    fVar3 = (b1->mAABB).mCenter.y;
    fVar4 = (this->mR1to0).m[1][0];
    fVar5 = (this->mR1to0).m[2][0];
    fVar6 = (b1->mAABB).mCenter.z;
    fVar28 = (fVar5 * fVar6 + fVar1 * fVar2 + fVar4 * fVar3 + (this->mT1to0).x) -
             (b0->mAABB).mCenter.x;
    fVar7 = (b0->mAABB).mExtents.x;
    fVar8 = (b1->mAABB).mExtents.x;
    fVar9 = (this->mAR).m[0][0];
    fVar10 = (b1->mAABB).mExtents.y;
    fVar11 = (this->mAR).m[1][0];
    fVar12 = (b1->mAABB).mExtents.z;
    fVar13 = (this->mAR).m[2][0];
    if ((uint)(fVar12 * fVar13 + fVar10 * fVar11 + fVar8 * fVar9 + fVar7) < (uint)ABS(fVar28)) {
      return;
    }
    fVar14 = (this->mR1to0).m[0][1];
    fVar15 = (this->mR1to0).m[1][1];
    fVar16 = (this->mR1to0).m[2][1];
    fVar30 = (fVar16 * fVar6 + fVar14 * fVar2 + fVar3 * fVar15 + (this->mT1to0).y) -
             (b0->mAABB).mCenter.y;
    fVar17 = (b0->mAABB).mExtents.y;
    fVar18 = (this->mAR).m[0][1];
    fVar19 = (this->mAR).m[1][1];
    fVar20 = (this->mAR).m[2][1];
    if ((uint)(fVar12 * fVar20 + fVar10 * fVar19 + fVar8 * fVar18 + fVar17) < (uint)ABS(fVar30)) {
      return;
    }
    fVar21 = (this->mR1to0).m[0][2];
    fVar22 = (this->mR1to0).m[1][2];
    fVar23 = (this->mR1to0).m[2][2];
    fVar29 = (fVar6 * fVar23 + fVar2 * fVar21 + fVar3 * fVar22 + (this->mT1to0).z) -
             (b0->mAABB).mCenter.z;
    fVar2 = (b0->mAABB).mExtents.z;
    fVar3 = (this->mAR).m[0][2];
    fVar6 = (this->mAR).m[1][2];
    fVar24 = (this->mAR).m[2][2];
    if ((uint)(fVar12 * fVar24 + fVar10 * fVar6 + fVar8 * fVar3 + fVar2) < (uint)ABS(fVar29)) {
      return;
    }
    if ((uint)(fVar2 * fVar3 + fVar7 * fVar9 + fVar17 * fVar18 + fVar8) <
        (uint)ABS(fVar29 * fVar21 + fVar28 * fVar1 + fVar14 * fVar30)) {
      return;
    }
    if ((uint)(fVar2 * fVar6 + fVar7 * fVar11 + fVar17 * fVar19 + fVar10) <
        (uint)ABS(fVar29 * fVar22 + fVar28 * fVar4 + fVar15 * fVar30)) {
      return;
    }
    if ((uint)(fVar2 * fVar24 + fVar7 * fVar13 + fVar17 * fVar20 + fVar12) <
        (uint)ABS(fVar29 * fVar23 + fVar28 * fVar5 + fVar16 * fVar30)) {
      return;
    }
    if ((uVar25 == 0 | this->mFullBoxBoxTest) == 1) {
      if ((uint)(fVar12 * fVar11 + fVar10 * fVar13 + fVar17 * fVar3 + fVar18 * fVar2) <
          (uint)ABS(fVar29 * fVar14 - fVar21 * fVar30)) {
        return;
      }
      if ((uint)(fVar12 * fVar9 + fVar8 * fVar13 + fVar17 * fVar6 + fVar19 * fVar2) <
          (uint)ABS(fVar29 * fVar15 + fVar22 * -fVar30)) {
        return;
      }
      if ((uint)(fVar10 * fVar9 + fVar8 * fVar11 + fVar17 * fVar24 + fVar20 * fVar2) <
          (uint)ABS(fVar29 * fVar16 + -fVar30 * fVar23)) {
        return;
      }
      if ((uint)(fVar12 * fVar19 + fVar10 * fVar20 + fVar7 * fVar3 + fVar9 * fVar2) <
          (uint)ABS(fVar21 * fVar28 - fVar1 * fVar29)) {
        return;
      }
      if ((uint)(fVar12 * fVar18 + fVar8 * fVar20 + fVar7 * fVar6 + fVar11 * fVar2) <
          (uint)ABS(fVar22 * fVar28 + fVar4 * -fVar29)) {
        return;
      }
      if ((uint)(fVar10 * fVar18 + fVar8 * fVar19 + fVar7 * fVar24 + fVar2 * fVar13) <
          (uint)ABS(fVar23 * fVar28 + -fVar29 * fVar5)) {
        return;
      }
      if ((uint)(fVar12 * fVar6 + fVar10 * fVar24 + fVar18 * fVar7 + fVar9 * fVar17) <
          (uint)ABS(fVar1 * fVar30 - fVar14 * fVar28)) {
        return;
      }
      if ((uint)(fVar12 * fVar3 + fVar24 * fVar8 + fVar19 * fVar7 + fVar11 * fVar17) <
          (uint)ABS(fVar4 * fVar30 + fVar15 * -fVar28)) {
        return;
      }
      if ((uint)(fVar10 * fVar3 + fVar8 * fVar6 + fVar7 * fVar20 + fVar13 * fVar17) <
          (uint)ABS(fVar30 * fVar5 + fVar16 * -fVar28)) {
        return;
      }
    }
    uVar26 = b0->mData;
    uVar27 = b1->mData;
    if ((uVar26 & 1) == 0) {
      if ((uVar27 & 1) == 0) {
        _Collide(this,(AABBCollisionNode *)(uVar26 + 0x20),(AABBCollisionNode *)(uVar27 + 0x20));
        if ((~(this->super_Collider).mFlags & 5) == 0) {
          return;
        }
        _Collide(this,(AABBCollisionNode *)(b0->mData + 0x20),(AABBCollisionNode *)b1->mData);
        if ((~(this->super_Collider).mFlags & 5) == 0) {
          return;
        }
        _Collide(this,(AABBCollisionNode *)b0->mData,(AABBCollisionNode *)(b1->mData + 0x20));
        if ((~(this->super_Collider).mFlags & 5) == 0) {
          return;
        }
        b1 = (AABBCollisionNode *)b1->mData;
      }
      else {
        _Collide(this,(AABBCollisionNode *)(uVar26 + 0x20),b1);
        if ((~(this->super_Collider).mFlags & 5) == 0) {
          return;
        }
      }
      b0 = (AABBCollisionNode *)b0->mData;
    }
    else {
      if ((uVar27 & 1) != 0) {
        PrimTest(this,(udword)(uVar26 >> 1),(udword)(uVar27 >> 1));
        return;
      }
      _Collide(this,b0,(AABBCollisionNode *)(uVar27 + 0x20));
      if ((~(this->super_Collider).mFlags & 5) == 0) {
        return;
      }
      b1 = (AABBCollisionNode *)b1->mData;
    }
  } while( true );
}

Assistant:

void AABBTreeCollider::_Collide(const AABBCollisionNode* b0, const AABBCollisionNode* b1)
{
	// Perform BV-BV overlap test
	if(!BoxBoxOverlap(b0->mAABB.mExtents, b0->mAABB.mCenter, b1->mAABB.mExtents, b1->mAABB.mCenter))
	{
		return;
	}

	if(b0->IsLeaf())
	{
		if(b1->IsLeaf())
		{
			PrimTest(b0->GetPrimitive(), b1->GetPrimitive());
		}
		else
		{
			_Collide(b0, b1->GetNeg());
			if(ContactFound()) return;
			_Collide(b0, b1->GetPos());
		}
	}
	else if(b1->IsLeaf())
	{
		_Collide(b0->GetNeg(), b1);
		if(ContactFound()) return;
		_Collide(b0->GetPos(), b1);
	}
	else
	{
		_Collide(b0->GetNeg(), b1->GetNeg());
		if(ContactFound()) return;
		_Collide(b0->GetNeg(), b1->GetPos());
		if(ContactFound()) return;
		_Collide(b0->GetPos(), b1->GetNeg());
		if(ContactFound()) return;
		_Collide(b0->GetPos(), b1->GetPos());
	}
}